

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subgetopt.c
# Opt level: O0

int subgetopt(int argc,char **argv,char *opts)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  char *local_30;
  char *s;
  int c;
  char *opts_local;
  char **argv_local;
  int argc_local;
  
  if (((argv == (char **)0x0) || (argc <= subgetoptind)) || (argv[subgetoptind] == (char *)0x0)) {
    subgetoptarg = (char *)0x0;
    return subgetoptdone;
  }
  if ((subgetoptpos != 0) && (argv[subgetoptind][subgetoptpos] == '\0')) {
    subgetoptind = subgetoptind + 1;
    subgetoptpos = 0;
    if ((argc <= subgetoptind) || (argv[subgetoptind] == (char *)0x0)) {
      subgetoptpos = 0;
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
  }
  if (subgetoptpos == 0) {
    if (*argv[subgetoptind] != '-') {
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
    subgetoptpos = 1;
    cVar1 = argv[subgetoptind][1];
    if ((cVar1 == '-') || (cVar1 == '\0')) {
      if (cVar1 != '\0') {
        subgetoptind = subgetoptind + 1;
      }
      subgetoptpos = 0;
      subgetoptarg = (char *)0x0;
      return subgetoptdone;
    }
  }
  iVar3 = (int)argv[subgetoptind][subgetoptpos];
  iVar4 = subgetoptpos + 1;
  pcVar2 = opts;
  while( true ) {
    local_30 = pcVar2;
    if (*local_30 == '\0') {
      subgetoptproblem = iVar3;
      subgetoptarg = (char *)0x0;
      subgetoptpos = iVar4;
      return 0x3f;
    }
    if (iVar3 == *local_30) break;
    pcVar2 = local_30 + 1;
    if (local_30[1] == ':') {
      pcVar2 = local_30 + 2;
    }
  }
  if (local_30[1] != ':') {
    subgetoptpos = iVar4;
    subgetoptarg = (char *)0x0;
    return iVar3;
  }
  lVar6 = (long)subgetoptind;
  iVar5 = subgetoptind + 1;
  if (argv[lVar6][iVar4] != '\0') {
    subgetoptind = iVar5;
    subgetoptpos = 0;
    subgetoptarg = argv[lVar6] + iVar4;
    return iVar3;
  }
  subgetoptarg = argv[iVar5];
  if ((iVar5 < argc) && (subgetoptarg != (char *)0x0)) {
    subgetoptind = subgetoptind + 2;
    subgetoptpos = 0;
    return iVar3;
  }
  subgetoptind = iVar5;
  subgetoptpos = 0;
  subgetoptproblem = iVar3;
  return 0x3f;
}

Assistant:

int sgopt(int argc,const char *const *argv,const char *opts)
{
  int c;
  const char *s;

  optarg = 0;
  if (!argv || (optind >= argc) || !argv[optind]) return optdone;
  if (optpos && !argv[optind][optpos]) {
    ++optind;
    optpos = 0;
    if ((optind >= argc) || !argv[optind]) return optdone;
  }
  if (!optpos) {
    if (argv[optind][0] != '-') return optdone;
    ++optpos;
    c = argv[optind][1];
    if ((c == '-') || (c == 0)) {
      if (c) ++optind;
      optpos = 0;
      return optdone;
    }
    /* otherwise c is reassigned below */
  }
  c = argv[optind][optpos];
  ++optpos;
  s = opts;
  while (*s) {
    if (c == *s) {
      if (s[1] == ':') {
        optarg = argv[optind] + optpos;
        ++optind;
        optpos = 0;
        if (!*optarg) {
          optarg = argv[optind];
          if ((optind >= argc) || !optarg) { /* argument past end */
            optproblem = c;
            return '?';
          }
          ++optind;
        }
      }
      return c;
    }
    ++s;
    if (*s == ':') ++s;
  }
  optproblem = c;
  return '?';
}